

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

char * igets(void)

{
  char *pcVar1;
  bool bVar2;
  char *line;
  
  line = PatchPt;
  if ((*PatchPt == '\0') || (PatchFile + PatchSize <= PatchPt)) {
    line = (char *)0x0;
  }
  else {
    while( true ) {
      bVar2 = false;
      if (*PatchPt != '\n') {
        bVar2 = *PatchPt != '\0';
      }
      if (!bVar2) break;
      PatchPt = PatchPt + 1;
    }
    if (*PatchPt == '\n') {
      pcVar1 = PatchPt + 1;
      *PatchPt = '\0';
      PatchPt = pcVar1;
    }
  }
  return line;
}

Assistant:

static char *igets (void)
{
	char *line;

	if (*PatchPt == '\0' || PatchPt >= PatchFile + PatchSize )
		return NULL;

	line = PatchPt;

	while (*PatchPt != '\n' && *PatchPt != '\0')
		PatchPt++;

	if (*PatchPt == '\n')
		*PatchPt++ = 0;

	return line;
}